

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qinputdevice.cpp
# Opt level: O2

void QInputDevicePrivate::unregisterDevice(QInputDevice *dev)

{
  Type *c;
  QLoggingCategory *pQVar1;
  QDebug *pQVar2;
  QBasicMutex *this;
  long in_FS_OFFSET;
  QDebug local_50;
  Stream *local_48;
  undefined1 local_40 [8];
  QInputDevice *local_38;
  undefined1 local_30 [16];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (-2 < (char)QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_deviceList>::guard._q_value.
                 super___atomic_base<signed_char>._M_i) {
    local_30._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    this = &devicesMutex;
    local_30._0_8_ = &devicesMutex;
    QBasicMutex::lock(&devicesMutex);
    local_30[8] = true;
    c = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_deviceList>_>::operator()
                  ((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_deviceList>_>
                    *)this);
    QtPrivate::sequential_erase_one<QList<QInputDevice_const*>,QInputDevice_const*>(c,&local_38);
    pQVar1 = QtPrivateLogging::lcQpaInputDevices();
    if (((pQVar1->field_2).bools.enabledInfo._q_value._M_base._M_i & 1U) != 0) {
      QMessageLogger::info();
      pQVar2 = QDebug::operator<<(&local_50,"Unregistered");
      local_48 = pQVar2->stream;
      local_48->ref = local_48->ref + 1;
      ::operator<<((Stream *)local_40,(QInputDevice *)&local_48);
      QDebug::~QDebug((QDebug *)local_40);
      QDebug::~QDebug((QDebug *)&local_48);
      QDebug::~QDebug(&local_50);
    }
    QMutexLocker<QBasicMutex>::~QMutexLocker((QMutexLocker<QBasicMutex> *)local_30);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QInputDevicePrivate::unregisterDevice(const QInputDevice *dev)
{
    if (deviceList.isDestroyed())
        return;     // nothing to remove!

    QMutexLocker lock(&devicesMutex);
    deviceList()->removeOne(dev);
    qCInfo(lcQpaInputDevices) << "Unregistered" << dev;
}